

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O3

void dg::llvmdg::LLVMSlicer::adjustPhiNodes(BasicBlock *pred,BasicBlock *blk)

{
  BasicBlock *pBVar1;
  int iVar2;
  
  for (pBVar1 = *(BasicBlock **)(pred + 0x30);
      ((pBVar1 != pred + 0x28 && (pBVar1 != (BasicBlock *)0x0)) && (pBVar1[-8] == (BasicBlock)0x52))
      ; pBVar1 = *(BasicBlock **)(pBVar1 + 8)) {
    iVar2 = llvm::PHINode::getBasicBlockIndex((PHINode *)(pBVar1 + -0x18),blk);
    if (-1 < iVar2) {
      llvm::PHINode::removeIncomingValue((uint)(PHINode *)(pBVar1 + -0x18),SUB41(iVar2,0));
    }
  }
  return;
}

Assistant:

static void adjustPhiNodes(llvm::BasicBlock *pred, llvm::BasicBlock *blk) {
        using namespace llvm;

        for (Instruction &I : *pred) {
            PHINode *phi = dyn_cast<PHINode>(&I);
            if (phi) {
                // don't try remove block that we already removed
                int idx = phi->getBasicBlockIndex(blk);
                if (idx < 0)
                    continue;

                // the second argument is DeletePHIIFEmpty.
                // We don't want that, since that would make
                // dependence graph inconsistent. We'll
                // slice it away later, if it's empty
                phi->removeIncomingValue(idx, false);
            } else {
                // phi nodes are always at the beginning of the block
                // so if this is the first value that is not PHI,
                // there won't be any other and we can bail out
                break;
            }
        }
    }